

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O2

void llvm::yaml::MappingTraits<llvm::DWARFYAML::Abbrev>::mapping(IO *IO,Abbrev *Abbrev)

{
  yaml::IO::mapRequired<llvm::yaml::Hex32>(IO,"Code",&Abbrev->Code);
  yaml::IO::mapRequired<llvm::dwarf::Tag>(IO,"Tag",&Abbrev->Tag);
  yaml::IO::mapRequired<llvm::dwarf::Constants>(IO,"Children",&Abbrev->Children);
  yaml::IO::
  mapRequired<std::vector<llvm::DWARFYAML::AttributeAbbrev,std::allocator<llvm::DWARFYAML::AttributeAbbrev>>>
            (IO,"Attributes",&Abbrev->Attributes);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::Abbrev>::mapping(IO &IO,
                                               DWARFYAML::Abbrev &Abbrev) {
  IO.mapRequired("Code", Abbrev.Code);
  IO.mapRequired("Tag", Abbrev.Tag);
  IO.mapRequired("Children", Abbrev.Children);
  IO.mapRequired("Attributes", Abbrev.Attributes);
}